

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggerC.cpp
# Opt level: O0

void defaultLogHandler(SoapySDRLogLevel logLevel,char *message)

{
  char *in_RSI;
  undefined4 in_EDI;
  
  switch(in_EDI) {
  case 1:
    fprintf(_stderr,"\x1b[1m\x1b[31m[FATAL] %s\x1b[0m\n",in_RSI);
    break;
  case 2:
    fprintf(_stderr,"\x1b[1m\x1b[31m[CRITICAL] %s\x1b[0m\n",in_RSI);
    break;
  case 3:
    fprintf(_stderr,"\x1b[1m\x1b[31m[ERROR] %s\x1b[0m\n",in_RSI);
    break;
  case 4:
    fprintf(_stderr,"\x1b[1m\x1b[33m[WARNING] %s\x1b[0m\n",in_RSI);
    break;
  case 5:
    fprintf(_stderr,"\x1b[32m[NOTICE] %s\x1b[0m\n",in_RSI);
    break;
  case 6:
    fprintf(_stderr,"[INFO] %s\n",in_RSI);
    break;
  case 7:
    fprintf(_stderr,"[DEBUG] %s\n",in_RSI);
    break;
  case 8:
    fprintf(_stderr,"[TRACE] %s\n",in_RSI);
    break;
  case 9:
    fputs(in_RSI,_stderr);
    fflush(_stderr);
  }
  return;
}

Assistant:

static void defaultLogHandler(const SoapySDRLogLevel logLevel, const char *message)
{
    switch (logLevel)
    {
    case SOAPY_SDR_FATAL:    fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_RED "[FATAL] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_CRITICAL: fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_RED "[CRITICAL] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_ERROR:    fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_RED "[ERROR] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_WARNING:  fprintf(stderr, ANSI_COLOR_BOLD ANSI_COLOR_YELLOW "[WARNING] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_NOTICE:   fprintf(stderr, ANSI_COLOR_GREEN "[NOTICE] %s" ANSI_COLOR_RESET "\n", message); break;
    case SOAPY_SDR_INFO:     fprintf(stderr, "[INFO] %s\n", message); break;
    case SOAPY_SDR_DEBUG:    fprintf(stderr, "[DEBUG] %s\n", message); break;
    case SOAPY_SDR_TRACE:    fprintf(stderr, "[TRACE] %s\n", message); break;
    case SOAPY_SDR_SSI:      fputs(message, stderr); fflush(stderr); break;
    }
}